

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
eastl::vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::~vector
          (vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this)

{
  vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this_local;
  
  DoDestroyValues(this,(this->
                       super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
                       ).mpBegin,
                  (this->
                  super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                  mpEnd);
  VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::~VectorBase
            (&this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
  ;
  return;
}

Assistant:

inline vector<T, Allocator>::~vector()
    {
        // Call destructor for the values. Parent class will free the memory.
        DoDestroyValues(mpBegin, mpEnd);
    }